

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjTransform(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,int n,uchar **dstBufs,
               unsigned_long *dstSizes,tjtransform *t,int flags)

{
  int iVar1;
  int iVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  unsigned_long uVar6;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  j_decompress_ptr pjVar7;
  j_decompress_ptr in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  uint in_stack_00000010;
  JBLOCKARRAY barray;
  tjregion planeRegion;
  tjregion arrayRegion;
  jpeg_component_info *compptr;
  JDIMENSION by;
  int y;
  int ci;
  int h;
  int w;
  j_decompress_ptr dinfo;
  j_compress_ptr cinfo;
  tjinstance *this;
  my_progress_mgr progress;
  int saveMarkers;
  int jpegSubsamp;
  int i;
  int alloc;
  int retval;
  jvirt_barray_ptr *dstcoefs;
  jvirt_barray_ptr *srccoefs;
  jpeg_transform_info *xinfo;
  int in_stack_fffffffffffffef8;
  JCOPY_OPTION in_stack_fffffffffffffefc;
  j_decompress_ptr in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  j_decompress_ptr in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  j_compress_ptr in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  int local_b8;
  int local_b4;
  j_decompress_ptr pjVar8;
  j_decompress_ptr pjVar9;
  code *local_90 [5];
  undefined4 local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  jvirt_barray_ptr *local_50;
  jvirt_barray_ptr *local_48;
  void *local_40;
  long local_38;
  int local_24;
  int local_4;
  
  local_40 = (void *)0x0;
  local_54 = 0;
  local_58 = 1;
  local_64 = 0;
  if (in_RDI == (j_decompress_ptr)0x0) {
    pcVar5 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(pcVar5,200,"Invalid handle");
    local_4 = -1;
  }
  else {
    *(undefined4 *)in_RDI[2].ac_huff_tbl_ptrs = 0;
    in_RDI[2].blocks_in_MCU = 0;
    *(uint *)((long)in_RDI[2].ac_huff_tbl_ptrs + 4) = (uint)((in_stack_00000010 & 0x2000) != 0);
    pjVar8 = in_RDI;
    pjVar9 = in_RDI;
    if ((((ulong)in_RDI[2].ac_huff_tbl_ptrs[1] & 1) == 0) ||
       (((ulong)in_RDI[2].ac_huff_tbl_ptrs[1] & 2) == 0)) {
      snprintf((char *)(in_RDI[2].ac_huff_tbl_ptrs + 2),200,"%s",
               "tjTransform(): Instance has not been initialized for transformation");
      pjVar9[2].blocks_in_MCU = 1;
      pcVar5 = (char *)__tls_get_addr(&PTR_001e8fc0);
      pjVar7 = (j_decompress_ptr)0xc8;
      snprintf(pcVar5,200,"%s","tjTransform(): Instance has not been initialized for transformation"
              );
      local_54 = -1;
    }
    else if (((((in_RSI == 0) || (in_RDX == 0)) || (in_ECX < 1)) || ((in_R8 == 0 || (in_R9 == 0))))
            || ((in_stack_00000008 == 0 || ((int)in_stack_00000010 < 0)))) {
      snprintf((char *)(in_RDI[2].ac_huff_tbl_ptrs + 2),200,"%s","tjTransform(): Invalid argument");
      pjVar9[2].blocks_in_MCU = 1;
      pcVar5 = (char *)__tls_get_addr(&PTR_001e8fc0);
      pjVar7 = (j_decompress_ptr)0xc8;
      snprintf(pcVar5,200,"%s","tjTransform(): Invalid argument");
      local_54 = -1;
    }
    else {
      local_38 = in_R9;
      local_24 = in_ECX;
      if ((in_stack_00000010 & 8) == 0) {
        if ((in_stack_00000010 & 0x10) == 0) {
          if ((in_stack_00000010 & 0x20) != 0) {
            putenv("JSIMD_FORCESSE2=1");
          }
        }
        else {
          putenv("JSIMD_FORCESSE=1");
        }
      }
      else {
        putenv("JSIMD_FORCEMMX=1");
      }
      if ((in_stack_00000010 & 0x8000) == 0) {
        in_RDI->Al = 0;
        in_RDI->unread_marker = 0;
      }
      else {
        memset(local_90,0,0x28);
        local_90[0] = my_progress_monitor;
        *(code ***)&in_RDI->Al = local_90;
      }
      local_40 = malloc((long)local_24 * 0x78);
      if (local_40 == (void *)0x0) {
        snprintf((char *)(pjVar9[2].ac_huff_tbl_ptrs + 2),200,"%s",
                 "tjTransform(): Memory allocation failure");
        pjVar9[2].blocks_in_MCU = 1;
        pcVar5 = (char *)__tls_get_addr(&PTR_001e8fc0);
        pjVar7 = (j_decompress_ptr)0xc8;
        snprintf(pcVar5,200,"%s","tjTransform(): Memory allocation failure");
        local_54 = -1;
      }
      else {
        pjVar7 = (j_decompress_ptr)0x0;
        memset(local_40,0,(long)local_24 * 0x78);
        iVar2 = _setjmp((__jmp_buf_tag *)&pjVar9[2].num_components);
        if (iVar2 == 0) {
          jpeg_mem_src_tj(in_stack_ffffffffffffff10,
                          (uchar *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                          (unsigned_long)in_stack_ffffffffffffff00);
          for (local_5c = 0; local_5c < local_24; local_5c = local_5c + 1) {
            *(JXFORM_CODE *)((long)local_40 + (long)local_5c * 0x78) =
                 xformtypes[*(int *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x10)];
            *(uint *)((long)local_40 + (long)local_5c * 0x78 + 4) =
                 (uint)((*(uint *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x14) & 1) != 0);
            *(uint *)((long)local_40 + (long)local_5c * 0x78 + 8) =
                 (uint)((*(uint *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x14) & 2) != 0);
            *(uint *)((long)local_40 + (long)local_5c * 0x78 + 0xc) =
                 (uint)((*(uint *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x14) & 8) != 0);
            *(uint *)((long)local_40 + (long)local_5c * 0x78 + 0x10) =
                 (uint)((*(uint *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x14) & 4) != 0);
            if ((local_24 == 1) || (*(int *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x10) != 1)
               ) {
              *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x14) = 0;
            }
            else {
              *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x14) = 1;
            }
            if (*(int *)((long)local_40 + (long)local_5c * 0x78 + 0x10) != 0) {
              *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x28) =
                   *(undefined4 *)(in_stack_00000008 + (long)local_5c * 0x28);
              *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x2c) = 1;
              *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x30) =
                   *(undefined4 *)(in_stack_00000008 + (long)local_5c * 0x28 + 4);
              *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x34) = 1;
              if (*(int *)(in_stack_00000008 + (long)local_5c * 0x28 + 8) == 0) {
                *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x18) = 0;
              }
              else {
                *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x18) =
                     *(undefined4 *)(in_stack_00000008 + (long)local_5c * 0x28 + 8);
                *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x1c) = 1;
              }
              if (*(int *)(in_stack_00000008 + (long)local_5c * 0x28 + 0xc) == 0) {
                *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x20) = 0;
              }
              else {
                *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x20) =
                     *(undefined4 *)(in_stack_00000008 + (long)local_5c * 0x28 + 0xc);
                *(undefined4 *)((long)local_40 + (long)local_5c * 0x78 + 0x24) = 1;
              }
            }
            if ((*(uint *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x14) & 0x40) == 0) {
              local_64 = 1;
            }
          }
          jcopy_markers_setup(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          pjVar7 = (j_decompress_ptr)0x1;
          jpeg_read_header(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          local_60 = getSubsamp((j_decompress_ptr)(in_RDI->MCU_membership + 9));
          if (local_60 < 0) {
            snprintf((char *)(pjVar9[2].ac_huff_tbl_ptrs + 2),200,"%s",
                     "tjTransform(): Could not determine subsampling type for JPEG image");
            pjVar9[2].blocks_in_MCU = 1;
            pcVar5 = (char *)__tls_get_addr(&PTR_001e8fc0);
            pjVar7 = (j_decompress_ptr)0xc8;
            snprintf(pcVar5,200,"%s",
                     "tjTransform(): Could not determine subsampling type for JPEG image");
            local_54 = -1;
          }
          else {
            for (local_5c = 0; local_5c < local_24; local_5c = local_5c + 1) {
              pjVar7 = (j_decompress_ptr)((long)local_40 + (long)local_5c * 0x78);
              bVar3 = jtransform_request_workspace(pjVar9,(jpeg_transform_info *)pjVar8);
              if (bVar3 == 0) {
                snprintf((char *)(pjVar9[2].ac_huff_tbl_ptrs + 2),200,"%s",
                         "tjTransform(): Transform is not perfect");
                pjVar9[2].blocks_in_MCU = 1;
                pcVar5 = (char *)__tls_get_addr(&PTR_001e8fc0);
                pjVar7 = (j_decompress_ptr)0xc8;
                snprintf(pcVar5,200,"%s","tjTransform(): Transform is not perfect");
                local_54 = -1;
                goto LAB_0018076e;
              }
              if ((*(int *)((long)local_40 + (long)local_5c * 0x78 + 0x10) != 0) &&
                 ((*(int *)(in_stack_00000008 + (long)local_5c * 0x28) %
                   *(int *)((long)local_40 + (long)local_5c * 0x78 + 0x70) != 0 ||
                  (*(int *)(in_stack_00000008 + (long)local_5c * 0x28 + 4) %
                   *(int *)((long)local_40 + (long)local_5c * 0x78 + 0x74) != 0)))) {
                pjVar7 = (j_decompress_ptr)0xc8;
                snprintf((char *)(pjVar9[2].ac_huff_tbl_ptrs + 2),200,
                         "To crop this JPEG image, x must be a multiple of %d\nand y must be a multiple of %d.\n"
                         ,(ulong)*(uint *)((long)local_40 + (long)local_5c * 0x78 + 0x70),
                         (ulong)*(uint *)((long)local_40 + (long)local_5c * 0x78 + 0x74));
                pjVar9[2].blocks_in_MCU = 1;
                local_54 = -1;
                goto LAB_0018076e;
              }
            }
            local_48 = jpeg_read_coefficients
                                 ((j_decompress_ptr)
                                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            for (local_5c = 0; local_5c < local_24; local_5c = local_5c + 1) {
              pjVar7 = pjVar8;
              if ((in_stack_00000010 & 0x400) != 0) {
                local_58 = 0;
                uVar6 = tjBufSize((int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                  (int)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
                *(unsigned_long *)(local_38 + (long)local_5c * 8) = uVar6;
                pjVar7 = pjVar8;
              }
              if ((*(uint *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x14) & 0x10) == 0) {
                jpeg_mem_dest_tj((j_compress_ptr)in_stack_ffffffffffffff10,
                                 (uchar **)
                                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                 (unsigned_long *)in_stack_ffffffffffffff00,
                                 in_stack_fffffffffffffefc);
              }
              jpeg_copy_critical_parameters
                        ((j_decompress_ptr)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (j_compress_ptr)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
              local_50 = jtransform_adjust_parameters
                                   ((j_decompress_ptr)
                                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                    (j_compress_ptr)in_stack_ffffffffffffff10,
                                    (jvirt_barray_ptr *)
                                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                    (jpeg_transform_info *)in_stack_ffffffffffffff00);
              if (((in_stack_00000010 & 0x4000) != 0) ||
                 ((*(uint *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x14) & 0x20) != 0)) {
                jpeg_simple_progression((j_compress_ptr)in_stack_ffffffffffffff10);
              }
              if ((*(uint *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x14) & 0x10) == 0) {
                jpeg_write_coefficients
                          ((j_compress_ptr)in_stack_ffffffffffffff00,
                           (jvirt_barray_ptr *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
                jcopy_markers_execute
                          (in_stack_ffffffffffffff10,
                           (j_compress_ptr)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (JCOPY_OPTION)((ulong)in_stack_ffffffffffffff00 >> 0x20));
              }
              else {
                jinit_c_master_control
                          ((j_compress_ptr)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
              }
              pjVar8 = pjVar7;
              jtransform_execute_transform
                        ((j_decompress_ptr)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38,
                         (jvirt_barray_ptr *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (jpeg_transform_info *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
              if (*(long *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x20) != 0) {
                for (local_b4 = 0; local_b4 < *(int *)&pjVar8->field_0x4c; local_b4 = local_b4 + 1)
                {
                  in_stack_ffffffffffffff38 =
                       (j_compress_ptr)(*(long *)&pjVar8->buffered_image + (long)local_b4 * 0x60);
                  in_stack_ffffffffffffff28 = 0;
                  in_stack_ffffffffffffff2c = 0;
                  in_stack_ffffffffffffff30 =
                       *(int *)((long)&in_stack_ffffffffffffff38->client_data + 4) << 3;
                  in_stack_ffffffffffffff34 = 8;
                  in_stack_ffffffffffffff18 = 0;
                  in_stack_ffffffffffffff1c = 0;
                  iVar2 = *(int *)((long)&in_stack_ffffffffffffff38->client_data + 4);
                  iVar1 = in_stack_ffffffffffffff38->is_decompressor;
                  for (in_stack_ffffffffffffff44 = 0;
                      in_stack_ffffffffffffff44 < (uint)in_stack_ffffffffffffff38->is_decompressor;
                      in_stack_ffffffffffffff44 =
                           *(int *)((long)&in_stack_ffffffffffffff38->mem + 4) +
                           in_stack_ffffffffffffff44) {
                    pjVar7 = (j_decompress_ptr)local_50[local_b4];
                    in_stack_ffffffffffffff10 =
                         (j_decompress_ptr)
                         (**(code **)(*(long *)&in_RDI->Se + 0x40))
                                   ((j_decompress_ptr)(in_RDI->MCU_membership + 9),pjVar7,
                                    in_stack_ffffffffffffff44,
                                    *(undefined4 *)((long)&in_stack_ffffffffffffff38->mem + 4),1);
                    for (local_b8 = 0;
                        local_b8 < *(int *)((long)&in_stack_ffffffffffffff38->mem + 4);
                        local_b8 = local_b8 + 1) {
                      in_stack_ffffffffffffff00 =
                           (j_decompress_ptr)(in_stack_00000008 + (long)local_5c * 0x28);
                      pjVar7 = (j_decompress_ptr)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
                      in_stack_fffffffffffffef8 = local_5c;
                      iVar4 = (**(code **)(in_stack_00000008 + (long)local_5c * 0x28 + 0x20))
                                        ((&in_stack_ffffffffffffff10->err)[local_b8],pjVar7,
                                         CONCAT44(in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30),
                                         CONCAT44(in_stack_ffffffffffffff1c,
                                                  in_stack_ffffffffffffff18),
                                         CONCAT44(iVar1 << 3,iVar2 << 3),local_b4);
                      if (iVar4 == -1) {
                        snprintf((char *)(pjVar9[2].ac_huff_tbl_ptrs + 2),200,"%s",
                                 "tjTransform(): Error in custom filter");
                        pjVar9[2].blocks_in_MCU = 1;
                        pcVar5 = (char *)__tls_get_addr(&PTR_001e8fc0);
                        pjVar7 = (j_decompress_ptr)0xc8;
                        snprintf(pcVar5,200,"%s","tjTransform(): Error in custom filter");
                        local_54 = -1;
                        goto LAB_0018076e;
                      }
                      in_stack_ffffffffffffff2c = in_stack_ffffffffffffff2c + 8;
                    }
                  }
                }
              }
              if ((*(uint *)(in_stack_00000008 + (long)local_5c * 0x28 + 0x14) & 0x10) == 0) {
                jpeg_finish_compress((j_compress_ptr)in_stack_ffffffffffffff00);
              }
            }
            jpeg_finish_decompress
                      ((j_decompress_ptr)
                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          }
        }
        else {
          local_54 = -1;
        }
      }
    }
LAB_0018076e:
    if (100 < pjVar8->global_state) {
      if (local_58 != 0) {
        (*pjVar8->src->skip_input_data)(pjVar8,(long)pjVar7);
      }
      jpeg_abort_compress((j_compress_ptr)0x1807a1);
    }
    if (200 < *(int *)((long)&in_RDI->main + 4)) {
      jpeg_abort_decompress((j_decompress_ptr)0x1807b9);
    }
    free(local_40);
    if (*(int *)pjVar9[2].ac_huff_tbl_ptrs != 0) {
      local_54 = -1;
    }
    *(undefined4 *)((long)pjVar9[2].ac_huff_tbl_ptrs + 4) = 0;
    local_4 = local_54;
  }
  return local_4;
}

Assistant:

DLLEXPORT int tjTransform(tjhandle handle, const unsigned char *jpegBuf,
                          unsigned long jpegSize, int n,
                          unsigned char **dstBufs, unsigned long *dstSizes,
                          tjtransform *t, int flags)
{
  jpeg_transform_info *xinfo = NULL;
  jvirt_barray_ptr *srccoefs, *dstcoefs;
  int retval = 0, alloc = 1, i, jpegSubsamp, saveMarkers = 0;
  struct my_progress_mgr progress;

  GET_INSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;
  if ((this->init & COMPRESS) == 0 || (this->init & DECOMPRESS) == 0)
    THROW("tjTransform(): Instance has not been initialized for transformation");

  if (jpegBuf == NULL || jpegSize <= 0 || n < 1 || dstBufs == NULL ||
      dstSizes == NULL || t == NULL || flags < 0)
    THROW("tjTransform(): Invalid argument");

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_LIMITSCANS) {
    MEMZERO(&progress, sizeof(struct my_progress_mgr));
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = this;
    dinfo->progress = &progress.pub;
  } else
    dinfo->progress = NULL;

  if ((xinfo =
       (jpeg_transform_info *)malloc(sizeof(jpeg_transform_info) * n)) == NULL)
    THROW("tjTransform(): Memory allocation failure");
  MEMZERO(xinfo, sizeof(jpeg_transform_info) * n);

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);

  for (i = 0; i < n; i++) {
    xinfo[i].transform = xformtypes[t[i].op];
    xinfo[i].perfect = (t[i].options & TJXOPT_PERFECT) ? 1 : 0;
    xinfo[i].trim = (t[i].options & TJXOPT_TRIM) ? 1 : 0;
    xinfo[i].force_grayscale = (t[i].options & TJXOPT_GRAY) ? 1 : 0;
    xinfo[i].crop = (t[i].options & TJXOPT_CROP) ? 1 : 0;
    if (n != 1 && t[i].op == TJXOP_HFLIP) xinfo[i].slow_hflip = 1;
    else xinfo[i].slow_hflip = 0;

    if (xinfo[i].crop) {
      xinfo[i].crop_xoffset = t[i].r.x;  xinfo[i].crop_xoffset_set = JCROP_POS;
      xinfo[i].crop_yoffset = t[i].r.y;  xinfo[i].crop_yoffset_set = JCROP_POS;
      if (t[i].r.w != 0) {
        xinfo[i].crop_width = t[i].r.w;  xinfo[i].crop_width_set = JCROP_POS;
      } else
        xinfo[i].crop_width = JCROP_UNSET;
      if (t[i].r.h != 0) {
        xinfo[i].crop_height = t[i].r.h;  xinfo[i].crop_height_set = JCROP_POS;
      } else
        xinfo[i].crop_height = JCROP_UNSET;
    }
    if (!(t[i].options & TJXOPT_COPYNONE)) saveMarkers = 1;
  }

  jcopy_markers_setup(dinfo, saveMarkers ? JCOPYOPT_ALL : JCOPYOPT_NONE);
  jpeg_read_header(dinfo, TRUE);
  jpegSubsamp = getSubsamp(dinfo);
  if (jpegSubsamp < 0)
    THROW("tjTransform(): Could not determine subsampling type for JPEG image");

  for (i = 0; i < n; i++) {
    if (!jtransform_request_workspace(dinfo, &xinfo[i]))
      THROW("tjTransform(): Transform is not perfect");

    if (xinfo[i].crop) {
      if ((t[i].r.x % xinfo[i].iMCU_sample_width) != 0 ||
          (t[i].r.y % xinfo[i].iMCU_sample_height) != 0) {
        snprintf(this->errStr, JMSG_LENGTH_MAX,
                 "To crop this JPEG image, x must be a multiple of %d\n"
                 "and y must be a multiple of %d.\n",
                 xinfo[i].iMCU_sample_width, xinfo[i].iMCU_sample_height);
        this->isInstanceError = TRUE;
        retval = -1;  goto bailout;
      }
    }
  }

  srccoefs = jpeg_read_coefficients(dinfo);

  for (i = 0; i < n; i++) {
    int w, h;

    if (!xinfo[i].crop) {
      w = dinfo->image_width;  h = dinfo->image_height;
    } else {
      w = xinfo[i].crop_width;  h = xinfo[i].crop_height;
    }
    if (flags & TJFLAG_NOREALLOC) {
      alloc = 0;  dstSizes[i] = tjBufSize(w, h, jpegSubsamp);
    }
    if (!(t[i].options & TJXOPT_NOOUTPUT))
      jpeg_mem_dest_tj(cinfo, &dstBufs[i], &dstSizes[i], alloc);
    jpeg_copy_critical_parameters(dinfo, cinfo);
    dstcoefs = jtransform_adjust_parameters(dinfo, cinfo, srccoefs, &xinfo[i]);
    if (flags & TJFLAG_PROGRESSIVE || t[i].options & TJXOPT_PROGRESSIVE)
      jpeg_simple_progression(cinfo);
    if (!(t[i].options & TJXOPT_NOOUTPUT)) {
      jpeg_write_coefficients(cinfo, dstcoefs);
      jcopy_markers_execute(dinfo, cinfo, t[i].options & TJXOPT_COPYNONE ?
                                          JCOPYOPT_NONE : JCOPYOPT_ALL);
    } else
      jinit_c_master_control(cinfo, TRUE);
    jtransform_execute_transformation(dinfo, cinfo, srccoefs, &xinfo[i]);
    if (t[i].customFilter) {
      int ci, y;
      JDIMENSION by;

      for (ci = 0; ci < cinfo->num_components; ci++) {
        jpeg_component_info *compptr = &cinfo->comp_info[ci];
        tjregion arrayRegion = {
          0, 0, compptr->width_in_blocks * DCTSIZE, DCTSIZE
        };
        tjregion planeRegion = {
          0, 0, compptr->width_in_blocks * DCTSIZE,
          compptr->height_in_blocks * DCTSIZE
        };

        for (by = 0; by < compptr->height_in_blocks;
             by += compptr->v_samp_factor) {
          JBLOCKARRAY barray = (dinfo->mem->access_virt_barray)
            ((j_common_ptr)dinfo, dstcoefs[ci], by, compptr->v_samp_factor,
             TRUE);

          for (y = 0; y < compptr->v_samp_factor; y++) {
            if (t[i].customFilter(barray[y][0], arrayRegion, planeRegion, ci,
                                  i, &t[i]) == -1)
              THROW("tjTransform(): Error in custom filter");
            arrayRegion.y += DCTSIZE;
          }
        }
      }
    }
    if (!(t[i].options & TJXOPT_NOOUTPUT)) jpeg_finish_compress(cinfo);
  }

  jpeg_finish_decompress(dinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) {
    if (alloc) (*cinfo->dest->term_destination) (cinfo);
    jpeg_abort_compress(cinfo);
  }
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  free(xinfo);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}